

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_TryEmplaceWithHintWorks_Test::TestBody
          (Btree_TryEmplaceWithHintWorks_Test *this)

{
  undefined1 auVar1 [12];
  bool bVar2;
  byte bVar3;
  field_type fVar4;
  byte bVar5;
  key_type *pkVar6;
  slot_type *psVar7;
  slot_type *psVar8;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar9;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  this_00;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar10;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  this_01;
  _Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  _Var11;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  this_02;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar12;
  reference __x;
  reference __y;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  pointer *__ptr;
  char cVar16;
  int i;
  int iVar17;
  char *pcVar18;
  tuple<int_&> *in_R9;
  uint uVar19;
  int iVar20;
  iterator iter;
  const_iterator hint;
  iterator iVar21;
  iterator iVar22;
  iterator iVar23;
  SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_false>
  SVar24;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  bVar25;
  iterator iVar26;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  local_d8;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  local_c8;
  AssertionResult gtest_ar;
  int calls;
  char local_89;
  btree_map<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>_>
  m;
  pair<int,_int> pair1024;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  local_60;
  uint local_4c;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *local_48;
  AssertionResult gtest_ar_;
  
  m.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
  ._M_head_impl.calls = (type)&calls;
  calls = 0;
  m.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
         ::EmptyNode()::empty_node;
  m.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  m.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  for (iVar17 = 0; iVar17 != 0x80; iVar17 = iVar17 + 1) {
    local_d8.node =
         (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          *)CONCAT44(iVar17,iVar17);
    btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
    ::insert_unique<std::pair<int,int>>
              ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
                *)&gtest_ar,
               (btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                *)&m,(key_type *)&local_d8,(pair<int,_int> *)&local_d8);
  }
  calls = 0;
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)0x7f0000007f;
  btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
  ::insert_unique<std::pair<int,int>>
            ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
              *)&gtest_ar,
             (btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
              *)&m,(key_type *)&local_d8,(pair<int,_int> *)&local_d8);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_d8.node._4_4_,4);
  testing::internal::CmpHelperGE<int,int>((internal *)&gtest_ar,"calls","4",&calls,(int *)&local_d8)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x884,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  calls = 0;
  iVar21 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::begin((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    *)&m);
  gtest_ar._0_4_ = 0xffffffff;
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_d8.node._4_4_,0xffffffff);
  iVar22 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
           ::try_emplace<int>((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                               *)&m,(const_iterator)iVar21,(key_type *)&gtest_ar,(int *)&local_d8);
  local_60.node = iVar22.node;
  local_60.position = iVar22.position;
  local_c8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_c8.node._4_4_,0x81);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)m.
          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .tree_.size_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"129","m.size()",(int *)&local_c8,(unsigned_long *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x889,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  iVar21 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::begin((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    *)&m);
  local_d8.node = iVar21.node;
  local_d8.position = iVar21.position;
  testing::internal::EqHelper::
  Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
            (&gtest_ar.success_,"m.begin()",&local_60,&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x88a,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_d8.node._4_4_,2);
  testing::internal::CmpHelperLE<int,int>((internal *)&gtest_ar,"calls","2",&calls,(int *)&local_d8)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x88b,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  calls = 0;
  pair1024.first = 0x400;
  pair1024.second = 0x400;
  iVar21 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::end((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  *)&m);
  pbVar9 = iVar21.node;
  local_c8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)&pair1024;
  uVar13 = iVar21.position;
  local_d8.node = pbVar9;
  local_d8.position = uVar13;
  gtest_ar_._0_8_ = &pair1024.second;
  if (m.
      super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
      .
      super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
      .
      super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
      .tree_.size_ == 0) {
LAB_001cf1e8:
    m.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
          )btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::new_leaf_root_node
                     ((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                       *)&m,1);
    m.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .tree_.rightmost_ =
         (node_type *)
         m.
         super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
         .
         super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
         .
         super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
         .tree_.root_.
         super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
         .
         super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
         .
         super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
         .
         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
         ._M_head_impl;
LAB_001cf1ff:
    SVar24 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
             ::internal_locate<int>
                       ((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         *)&m,&pair1024.first);
    bVar25._8_8_ = SVar24.value._8_8_;
    bVar25.node = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   *)(ulong)(uint)SVar24.value.position;
    bVar25 = btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
             ::
             internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>,std::pair<int_const,int>&,std::pair<int_const,int>*>>
                       ((btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                         *)SVar24.value.node,bVar25);
    pbVar9 = bVar25.node;
    uVar13 = bVar25.position;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = uVar13;
    gtest_ar._0_8_ = pbVar9;
    if (pbVar9 != (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   *)0x0) {
      pkVar6 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
               ::key((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                      *)&gtest_ar);
      iVar20 = pair1024.first;
      iVar17 = *pkVar6;
      *(int *)m.
              super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .
              super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .tree_.root_.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
              ._M_head_impl.calls =
           *(int *)m.
                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .tree_.root_.
                   super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                   .
                   super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                   ._M_head_impl.calls + 1;
      if (iVar17 <= iVar20) goto LAB_001cf26e;
    }
    iVar21._12_4_ = 0;
    iVar21.node = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   *)SUB128(SVar24.value._0_12_,0);
    iVar21.position = SUB124(SVar24.value._0_12_,8);
    iVar21 = btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
             ::
             internal_emplace<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int&>>
                       ((btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                         *)&m,iVar21,(piecewise_construct_t *)&local_c8,
                        (tuple<const_int_&> *)&gtest_ar_,in_R9);
    auVar1 = iVar21._0_12_;
  }
  else {
    iVar23 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    *)&m);
    if (iVar23.node == pbVar9 && iVar23.position == uVar13) {
LAB_001cf0f6:
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = local_d8._12_4_;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = local_d8.position;
      gtest_ar._0_8_ = local_d8.node;
      iVar23 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::begin((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        *)&m);
      if (iVar23.node != pbVar9 || iVar23.position != uVar13) {
        btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
        ::operator--((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                      *)&gtest_ar);
        pkVar6 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                 ::key((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                        *)&gtest_ar);
        iVar17 = *pkVar6;
        iVar20 = pair1024.first;
        *(int *)m.
                super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .tree_.root_.
                super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                ._M_head_impl.calls =
             *(int *)m.
                     super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                     .
                     super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                     .tree_.root_.
                     super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                     .
                     super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                     ._M_head_impl.calls + 1;
        if (iVar20 <= iVar17) {
LAB_001cf1e0:
          if (m.
              super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .
              super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .tree_.size_ == 0) goto LAB_001cf1e8;
          goto LAB_001cf1ff;
        }
      }
      iVar23._12_4_ = 0;
      iVar23.node = (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     *)SUB128(iVar21._0_12_,0);
      iVar23.position = SUB124(iVar21._0_12_,8);
      iVar21 = btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
               ::
               internal_emplace<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int&>>
                         ((btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                           *)&m,iVar23,(piecewise_construct_t *)&local_c8,
                          (tuple<const_int_&> *)&gtest_ar_,in_R9);
      auVar1 = iVar21._0_12_;
    }
    else {
      pkVar6 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
               ::key(&local_d8);
      iVar20 = pair1024.first;
      iVar17 = *pkVar6;
      *(int *)m.
              super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .
              super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .tree_.root_.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
              ._M_head_impl.calls =
           *(int *)m.
                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .tree_.root_.
                   super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                   .
                   super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                   ._M_head_impl.calls + 1;
      if (iVar20 < iVar17) goto LAB_001cf0f6;
      pkVar6 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
               ::key(&local_d8);
      iVar17 = *pkVar6;
      iVar20 = pair1024.first;
      *(int *)m.
              super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .
              super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              .tree_.root_.
              super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              .
              super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
              ._M_head_impl.calls =
           *(int *)m.
                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .tree_.root_.
                   super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                   .
                   super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                   ._M_head_impl.calls + 1;
      if (iVar20 <= iVar17) goto LAB_001cf26e;
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
      ::operator++(&local_d8);
      iVar21 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::end((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      *)&m);
      uVar15 = iVar21._8_8_;
      if ((local_d8.node != iVar21.node) || (local_d8.position != iVar21.position)) {
        pkVar6 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                 ::key(&local_d8);
        iVar20 = pair1024.first;
        iVar17 = *pkVar6;
        *(int *)m.
                super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .tree_.root_.
                super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                .
                super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                ._M_head_impl.calls =
             *(int *)m.
                     super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                     .
                     super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                     .tree_.root_.
                     super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                     .
                     super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_false>
                     ._M_head_impl.calls + 1;
        if (iVar20 < iVar17) {
          uVar15 = (ulong)(uint)local_d8.position;
          goto LAB_001cf1c4;
        }
        goto LAB_001cf1e0;
      }
LAB_001cf1c4:
      iter._8_8_ = uVar15;
      iter.node = local_d8.node;
      iVar21 = btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
               ::
               internal_emplace<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int&>>
                         ((btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::__0,std::allocator<std::pair<int_const,int>>,256,false>>
                           *)&m,iter,(piecewise_construct_t *)&local_c8,
                          (tuple<const_int_&> *)&gtest_ar_,in_R9);
      auVar1 = iVar21._0_12_;
    }
  }
  pbVar9 = auVar1._0_8_;
  uVar13 = auVar1._8_4_;
LAB_001cf26e:
  local_c8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_c8.node._4_4_,0x82);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)m.
          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .tree_.size_;
  local_60.node = pbVar9;
  local_60.position = uVar13;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"130","m.size()",(int *)&local_c8,(unsigned_long *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x891,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  iVar21 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::end((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  *)&m);
  local_d8.node = iVar21.node;
  local_d8.position = iVar21.position;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  ::operator--(&local_d8);
  testing::internal::EqHelper::
  Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
            (&gtest_ar.success_,"--m.end()",&local_60,&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x892,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_d8.node._4_4_,2);
  testing::internal::CmpHelperLE<int,int>((internal *)&gtest_ar,"calls","2",&calls,(int *)&local_d8)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x893,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  calls = 0;
  iVar21 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::end((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  *)&m);
  gtest_ar._0_4_ = 0x10;
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_d8.node._4_4_,0x11);
  iVar22 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
           ::try_emplace<int>((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                               *)&m,(const_iterator)iVar21,(key_type *)&gtest_ar,(int *)&local_d8);
  local_60.node = iVar22.node;
  local_60.position = iVar22.position;
  local_c8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_c8.node._4_4_,0x82);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)m.
          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .tree_.size_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"130","m.size()",(int *)&local_c8,(unsigned_long *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x898,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_d8.node._4_4_,4);
  testing::internal::CmpHelperGE<int,int>((internal *)&gtest_ar,"calls","4",&calls,(int *)&local_d8)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x899,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_c8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_c8.node._4_4_,0x10);
  iVar26 = btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
           ::find<int>((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                        *)&m,(key_arg<int> *)&local_c8);
  local_d8.node = iVar26.node;
  local_d8.position = iVar26.position;
  testing::internal::EqHelper::
  Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
            (&gtest_ar.success_,"m.find(16)",&local_60,&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x89a,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  calls = 0;
  hint.position = local_60.position;
  hint.node = local_60.node;
  gtest_ar._0_4_ = 0x10;
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_d8.node._4_4_,0x11);
  hint._12_4_ = 0;
  iVar22 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
           ::try_emplace<int>(&m.
                               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                              ,hint,(key_type *)&gtest_ar,(int *)&local_d8);
  local_60.node = iVar22.node;
  local_60.position = iVar22.position;
  local_c8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_c8.node._4_4_,0x82);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)m.
          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .tree_.size_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"130","m.size()",(int *)&local_c8,(unsigned_long *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x89f,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_d8.node._4_4_,2);
  testing::internal::CmpHelperLE<int,int>((internal *)&gtest_ar,"calls","2",&calls,(int *)&local_d8)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x8a0,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_c8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_c8.node._4_4_,0x10);
  iVar26 = btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
           ::find<int>((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                        *)&m,(key_arg<int> *)&local_c8);
  local_d8.node = iVar26.node;
  local_d8.position = iVar26.position;
  testing::internal::EqHelper::
  Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_nullptr>
            (&gtest_ar.success_,"m.find(16)",&local_60,&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x8a1,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_c8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_c8.node._4_4_,2);
  iVar21 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::internal_find<int>
                     ((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                       *)&m,(int *)&local_c8);
  pbVar9 = iVar21.node;
  if (pbVar9 != (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 *)0x0) {
    uVar13 = iVar21.position;
    local_d8.node = pbVar9;
    local_d8.position = uVar13;
    local_89 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::leaf(pbVar9);
    if (!(bool)local_89) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
      ::operator--(&local_d8);
      bVar2 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::leaf(local_d8.node);
      if (!bVar2) {
        __assert_fail("iter.node->leaf()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xa7e,
                      "iterator phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::erase(iterator) [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      psVar7 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::slot(local_d8.node,(long)local_d8.position);
      psVar8 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::slot(pbVar9,(long)(int)uVar13);
      (psVar8->value).first = (psVar7->value).first;
      (psVar8->value).second = (psVar7->value).second;
      pbVar9 = local_d8.node;
      uVar13 = local_d8.position;
    }
    btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
    ::remove_value(pbVar9,uVar13,(allocator_type *)&m);
    m.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .tree_.size_ = m.
                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                   .tree_.size_ - 1;
    bVar2 = true;
    this_02._M_head_impl = local_d8.node;
    this_01._M_head_impl = local_d8.node;
    uVar13 = local_d8.position;
    uVar19 = local_d8.position;
    while ((_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
            )this_01._M_head_impl !=
           (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
            )m.
             super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
             .
             super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
             .
             super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
             .
             super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
             .
             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
             ._M_head_impl) {
      bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::count(this_01._M_head_impl);
      cVar16 = local_89;
      _Var11.
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
      ._M_head_impl =
           (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
            )(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
              )this_02._M_head_impl;
      if (0xe < bVar3) goto LAB_001cfc8d;
      local_4c = uVar13;
      local_48 = this_02._M_head_impl;
      pbVar9 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::parent(this_01._M_head_impl);
      fVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::position(this_01._M_head_impl);
      if (fVar4 == '\0') {
LAB_001cf9b2:
        bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::position(this_01._M_head_impl);
        bVar5 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::count(pbVar9);
        if (bVar3 < bVar5) {
          bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::position(this_01._M_head_impl);
          pbVar10 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::child(pbVar9,(ulong)bVar3 + 1);
          fVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::max_count(pbVar10);
          if (fVar4 != '\x1e') {
            __assert_fail("right->max_count() == kNodeValues",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xbd0,
                          "bool phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::count(this_01._M_head_impl);
          bVar5 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::count(pbVar10);
          if ((uint)bVar5 + (uint)bVar3 + 1 < 0x1f) {
            btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::merge_nodes((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           *)&m,this_01._M_head_impl,pbVar10);
            this_00._M_head_impl = this_01._M_head_impl;
            goto LAB_001cfa54;
          }
          bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::count(pbVar10);
          if ((bVar3 < 0x10) ||
             (fVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      ::count(this_01._M_head_impl), (int)uVar19 < 1 && fVar4 != '\0'))
          goto LAB_001cfb5f;
          bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::count(pbVar10);
          bVar5 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::count(this_01._M_head_impl);
          iVar20 = (int)((short)((ushort)bVar3 - (ushort)bVar5) / 2);
          bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::count(pbVar10);
          iVar17 = bVar3 - 1;
          if (iVar20 <= (int)(bVar3 - 1)) {
            iVar17 = iVar20;
          }
          btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::rebalance_right_to_left(this_01._M_head_impl,iVar17,pbVar10,(allocator_type *)&m);
        }
        else {
LAB_001cfb5f:
          fVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::position(this_01._M_head_impl);
          if (fVar4 != '\0') {
            bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::position(this_01._M_head_impl);
            pbVar9 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     ::child(pbVar9,(ulong)bVar3 - 1);
            bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::count(pbVar9);
            if ((0xf < bVar3) &&
               ((fVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         ::count(this_01._M_head_impl), fVar4 == '\0' ||
                (bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         ::count(this_01._M_head_impl), (int)uVar19 < (int)(uint)bVar3)))) {
              bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      ::count(pbVar9);
              bVar5 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      ::count(this_01._M_head_impl);
              iVar20 = (int)((short)((ushort)bVar3 - (ushort)bVar5) / 2);
              bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      ::count(pbVar9);
              iVar17 = bVar3 - 1;
              if (iVar20 <= (int)(bVar3 - 1)) {
                iVar17 = iVar20;
              }
              btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::rebalance_left_to_right(pbVar9,iVar17,this_01._M_head_impl,(allocator_type *)&m);
              uVar19 = iVar17 + uVar19;
            }
          }
        }
        this_02._M_head_impl = local_48;
        uVar13 = local_4c;
        cVar16 = local_89;
        _Var11.
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
        ._M_head_impl =
             (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
              )(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                )local_48;
        if (bVar2) {
          this_02._M_head_impl = this_01._M_head_impl;
          uVar13 = uVar19;
          _Var11.
          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
          ._M_head_impl =
               (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                )(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                  )this_01._M_head_impl;
        }
        goto LAB_001cfc8d;
      }
      bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::position(this_01._M_head_impl);
      this_00._M_head_impl =
           btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::child(pbVar9,(ulong)bVar3 - 1);
      fVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::max_count(this_00._M_head_impl);
      if (fVar4 != '\x1e') {
        __assert_fail("left->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xbc5,
                      "bool phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::count(this_00._M_head_impl);
      bVar5 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::count(this_01._M_head_impl);
      if (0x1e < (uint)bVar5 + (uint)bVar3 + 1) goto LAB_001cf9b2;
      bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::count(this_00._M_head_impl);
      btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
      ::merge_nodes((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     *)&m,this_00._M_head_impl,this_01._M_head_impl);
      uVar19 = uVar19 + bVar3 + 1;
LAB_001cfa54:
      this_02._M_head_impl = local_48;
      uVar13 = local_4c;
      if (bVar2) {
        this_02._M_head_impl = this_00._M_head_impl;
        uVar13 = uVar19;
      }
      bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::position(this_00._M_head_impl);
      uVar19 = (uint)bVar3;
      this_01._M_head_impl =
           btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::parent(this_00._M_head_impl);
      bVar2 = false;
    }
    gtest_ar._0_8_ = this_02._M_head_impl;
    fVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::count((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     *)m.
                       super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                       .
                       super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                       .tree_.root_.
                       super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                       .
                       super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                       .
                       super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                       ._M_head_impl);
    cVar16 = local_89;
    if (fVar4 == '\0') {
      bVar2 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::leaf((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      *)m.
                        super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                        .
                        super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                        .
                        super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                        .tree_.root_.
                        super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                        .
                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                        ._M_head_impl);
      if (bVar2) {
        if (m.
            super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
            .
            super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
            .
            super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
            .tree_.size_ != 0) {
          __assert_fail("size() == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xbfc,
                        "void phmap::priv::btree<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::try_shrink() [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                       );
        }
        btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        ::delete_leaf_node((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                            *)&m,(node_type *)
                                 m.
                                 super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                 .
                                 super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                 .
                                 super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                                 .tree_.root_.
                                 super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                                 ._M_head_impl);
        m.
        super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
        ._M_head_impl =
             (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              )btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
               ::EmptyNode()::empty_node;
        m.
        super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .tree_.rightmost_ =
             (node_type *)
             btree<phmap::priv::map_params<int,int,phmap::priv::(anonymous_namespace)::Btree_TryEmplaceWithHintWorks_Test::TestBody()::$_0,std::allocator<std::pair<int_const,int>>,256,false>>
             ::EmptyNode()::empty_node;
      }
      else {
        _Var11.
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
        ._M_head_impl =
             (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
              )btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::child((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        *)m.
                          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                          .
                          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                          .
                          super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                          .tree_.root_.
                          super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          .
                          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                          .
                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                          ._M_head_impl,0);
        pbVar9 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::parent((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           *)_Var11.
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                             ._M_head_impl);
        bVar2 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::is_root(pbVar9);
        if (!bVar2) {
          __assert_fail("parent()->is_root()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x4ad,
                        "void phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>::make_root() [Params = phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>]"
                       );
        }
        pbVar9 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::parent((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           *)_Var11.
                             super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                             ._M_head_impl);
        pbVar9 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::parent(pbVar9);
        btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        ::set_parent((btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      *)_Var11.
                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                        ._M_head_impl,pbVar9);
        btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        ::delete_internal_node
                  ((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    *)&m,(node_type *)
                         m.
                         super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                         .
                         super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                         .
                         super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                         .tree_.root_.
                         super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                         .
                         super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                         .
                         super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                         .
                         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                         ._M_head_impl);
        m.
        super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
        ._M_head_impl =
             (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
              )(_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                )_Var11.
                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                 ._M_head_impl;
      }
    }
    _Var11.
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         (_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
          )(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
            )gtest_ar._0_8_;
    if (m.
        super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
        .tree_.size_ == 0) {
      iVar21 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::end((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      *)&m);
      this_02._M_head_impl = iVar21.node;
      uVar13 = iVar21.position;
    }
    else {
LAB_001cfc8d:
      gtest_ar._0_8_ =
           _Var11.
           super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
           ._M_head_impl;
      bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              ::count(this_02._M_head_impl);
      if (uVar13 == bVar3) {
        bVar3 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::count(this_02._M_head_impl);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = bVar3 - 1;
        btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
        ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                      *)&gtest_ar);
        this_02._M_head_impl =
             (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              *)gtest_ar._0_8_;
        uVar13 = (uint)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
      }
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = uVar13;
    gtest_ar._0_8_ = this_02._M_head_impl;
    if (cVar16 == '\0') {
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
      ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                    *)&gtest_ar);
    }
  }
  local_c8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_c8.node._4_4_,0x81);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)m.
          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .tree_.size_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"129","m.size()",(int *)&local_c8,(unsigned_long *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x8a4,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  iVar26 = btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
           ::find<int>((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                        *)&m,(key_arg<int> *)&gtest_ar);
  calls = 0;
  gtest_ar._0_4_ = 2;
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_d8.node._4_4_,2);
  btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  ::try_emplace<int>(&m.
                      super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                     ,(const_iterator)iVar26,(key_type *)&gtest_ar,(int *)&local_d8);
  local_c8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_c8.node._4_4_,0x82);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)m.
          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
          .tree_.size_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"130","m.size()",(int *)&local_c8,(unsigned_long *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x8a9,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_d8.node =
       (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
        *)CONCAT44(local_d8.node._4_4_,2);
  testing::internal::CmpHelperLE<int,int>((internal *)&gtest_ar,"calls","2",&calls,(int *)&local_d8)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x8aa,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  iVar21 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::begin((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    *)&m);
  pbVar9 = iVar21.node;
  uVar13 = iVar21.position;
  iVar21 = btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::end((btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  *)&m);
  pbVar12 = iVar21.node;
  uVar14 = iVar21.position;
  pbVar10 = pbVar9;
  uVar19 = uVar13;
  if (pbVar9 != pbVar12 || uVar13 != uVar14) {
    local_c8.node = pbVar9;
    local_c8.position = uVar13;
    btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
    ::operator++(&local_c8);
    while (pbVar10 = pbVar12, uVar19 = uVar14,
          local_c8.position != uVar14 || local_c8.node != pbVar12) {
      gtest_ar._0_8_ = local_c8.node;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = local_c8.position;
      local_d8.node = pbVar9;
      local_d8.position = uVar13;
      __x = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
            ::operator*((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                         *)&gtest_ar);
      __y = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
            ::operator*(&local_d8);
      bVar2 = std::operator<(__x,__y);
      uVar13 = local_c8.position;
      pbVar9 = local_c8.node;
      pbVar10 = local_c8.node;
      uVar19 = local_c8.position;
      if (bVar2) break;
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
      ::operator++(&local_c8);
    }
  }
  gtest_ar_.success_ = uVar19 == uVar14 && pbVar10 == pbVar12;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (uVar19 != uVar14 || pbVar10 != pbVar12) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"std::is_sorted(m.begin(), m.end())","false","true",(char *)in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x8ac,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_d8.node !=
        (btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_d8.node + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  ::~btree_container((btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                      *)&m);
  return;
}

Assistant:

TEST(Btree, TryEmplaceWithHintWorks) {
        // Use a counting comparator here to verify that hint is used.
        int calls = 0;
        auto cmp = [&calls](int x, int y) {
            ++calls;
            return x < y;
        };
        using Cmp = decltype(cmp);

        phmap::btree_map<int, int, Cmp> m(cmp);
        for (int i = 0; i < 128; ++i) {
            m.emplace(i, i);
        }

        // Sanity check for the comparator
        calls = 0;
        m.emplace(127, 127);
        EXPECT_GE(calls, 4);

        // Try with begin hint:
        calls = 0;
        auto it = m.try_emplace(m.begin(), -1, -1);
        EXPECT_EQ(129, m.size());
        EXPECT_EQ(it, m.begin());
        EXPECT_LE(calls, 2);

        // Try with end hint:
        calls = 0;
        std::pair<int, int> pair1024 = {1024, 1024};
        it = m.try_emplace(m.end(), pair1024.first, pair1024.second);
        EXPECT_EQ(130, m.size());
        EXPECT_EQ(it, --m.end());
        EXPECT_LE(calls, 2);

        // Try value already present, bad hint; ensure no duplicate added:
        calls = 0;
        it = m.try_emplace(m.end(), 16, 17);
        EXPECT_EQ(130, m.size());
        EXPECT_GE(calls, 4);
        EXPECT_EQ(it, m.find(16));

        // Try value already present, hint points directly to it:
        calls = 0;
        it = m.try_emplace(it, 16, 17);
        EXPECT_EQ(130, m.size());
        EXPECT_LE(calls, 2);
        EXPECT_EQ(it, m.find(16));

        m.erase(2);
        EXPECT_EQ(129, m.size());
        auto hint = m.find(3);
        // Try emplace in the middle of two other elements.
        calls = 0;
        m.try_emplace(hint, 2, 2);
        EXPECT_EQ(130, m.size());
        EXPECT_LE(calls, 2);

        EXPECT_TRUE(std::is_sorted(m.begin(), m.end()));
    }